

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O1

void get_range<double,unsigned_long>
               (size_t col_num,size_t nrows,double *Xc,unsigned_long *Xc_ind,
               unsigned_long *Xc_indptr,MissingAction missing_action,double *xmin,double *xmax,
               bool *unsplittable)

{
  double dVar1;
  ulong uVar2;
  bool bVar3;
  unsigned_long ix;
  ulong uVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  *xmin = INFINITY;
  *xmax = -INFINITY;
  uVar4 = Xc_indptr[col_num];
  uVar2 = Xc_indptr[col_num + 1];
  if (uVar2 - uVar4 < nrows) {
    *xmin = 0.0;
    *xmax = 0.0;
  }
  if (missing_action == Fail) {
    if (uVar4 < uVar2) {
      dVar6 = *xmin;
      dVar5 = *xmax;
      do {
        dVar1 = Xc[uVar4];
        dVar7 = dVar1;
        if (dVar6 <= dVar1) {
          dVar7 = dVar6;
        }
        if (dVar1 <= dVar5) {
          dVar1 = dVar5;
        }
        uVar4 = uVar4 + 1;
        dVar6 = dVar7;
        dVar5 = dVar1;
      } while (uVar2 != uVar4);
      *xmin = dVar7;
      *xmax = dVar1;
    }
  }
  else if (uVar4 < uVar2) {
    dVar5 = *xmax;
    dVar6 = *xmin;
    do {
      dVar1 = Xc[uVar4];
      if (ABS(dVar1) != INFINITY) {
        dVar7 = dVar1;
        if (dVar6 <= dVar1) {
          dVar7 = dVar6;
        }
        dVar6 = (double)(~-(ulong)NAN(dVar6) & (ulong)dVar7 | -(ulong)NAN(dVar6) & (ulong)dVar1);
        *xmin = dVar6;
        dVar7 = dVar1;
        if (dVar1 <= dVar5) {
          dVar7 = dVar5;
        }
        dVar5 = (double)(~-(ulong)NAN(dVar5) & (ulong)dVar7 | -(ulong)NAN(dVar5) & (ulong)dVar1);
        *xmax = dVar5;
      }
      uVar4 = uVar4 + 1;
    } while (uVar2 != uVar4);
  }
  dVar5 = *xmin;
  dVar6 = *xmax;
  bVar3 = true;
  if (((dVar5 != dVar6) || (NAN(dVar5) || NAN(dVar6))) && (dVar5 != INFINITY || dVar6 != -INFINITY))
  {
    bVar3 = NAN(dVar6);
  }
  *unsplittable = bVar3;
  return;
}

Assistant:

void get_range(size_t col_num, size_t nrows,
               real_t *restrict Xc, sparse_ix *restrict Xc_ind, sparse_ix *restrict Xc_indptr,
               MissingAction missing_action, double &restrict xmin, double &restrict xmax, bool &unsplittable) noexcept
{
    xmin =  HUGE_VAL;
    xmax = -HUGE_VAL;

    if ((size_t)(Xc_indptr[col_num+1] - Xc_indptr[col_num]) < nrows)
    {
        xmin = 0;
        xmax = 0;
    }

    if (missing_action == Fail)
    {
        for (auto ix = Xc_indptr[col_num]; ix < Xc_indptr[col_num+1]; ix++)
        {
            xmin = (Xc[ix] < xmin)? Xc[ix] : xmin;
            xmax = (Xc[ix] > xmax)? Xc[ix] : xmax;
        }
    }

    else
    {
        for (auto ix = Xc_indptr[col_num]; ix < Xc_indptr[col_num+1]; ix++)
        {
            if (unlikely(std::isinf(Xc[ix]))) continue;
            xmin = std::fmin(xmin, Xc[ix]);
            xmax = std::fmax(xmax, Xc[ix]);
        }
    }

    unsplittable = (xmin == xmax) || (xmin == HUGE_VAL && xmax == -HUGE_VAL) || std::isnan(xmin) || std::isnan(xmax);
}